

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int map_extend(wally_map *dst,wally_map *src,_func_int_uchar_ptr_size_t *check_fn)

{
  bool bVar1;
  ulong local_30;
  size_t i;
  int ret;
  _func_int_uchar_ptr_size_t *check_fn_local;
  wally_map *src_local;
  wally_map *dst_local;
  
  i._4_4_ = 0;
  if (src != (wally_map *)0x0) {
    local_30 = 0;
    while( true ) {
      bVar1 = false;
      if (i._4_4_ == 0) {
        bVar1 = local_30 < src->num_items;
      }
      if (!bVar1) break;
      i._4_4_ = map_add(dst,src->items[local_30].key,src->items[local_30].key_len,
                        src->items[local_30].value,src->items[local_30].value_len,false,check_fn,
                        true);
      local_30 = local_30 + 1;
    }
  }
  return i._4_4_;
}

Assistant:

static int map_extend(struct wally_map *dst, const struct wally_map *src,
                      int (*check_fn)(const unsigned char *key, size_t key_len))
{
    int ret = WALLY_OK;
    size_t i;

    if (src) {
        for (i = 0; ret == WALLY_OK && i < src->num_items; ++i)
            ret = map_add(dst, src->items[i].key, src->items[i].key_len,
                          src->items[i].value, src->items[i].value_len,
                          false, check_fn, true);
    }
    return ret;
}